

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O1

Node * __thiscall
Parser::createFunctionParametersListNode
          (Parser *this,Token *t,vector<Token_*,_std::allocator<Token_*>_> *params_tokens,
          vector<Node_*,_std::allocator<Node_*>_> *params,
          vector<Node_*,_std::allocator<Node_*>_> *default_values)

{
  pointer *pppNVar1;
  Token *pTVar2;
  iterator iVar3;
  pointer ppNVar4;
  Node *this_00;
  Node *pNVar5;
  Node **__args;
  long lVar6;
  ulong uVar7;
  Node *param;
  Node *local_58;
  vector<Node*,std::allocator<Node*>> *local_50;
  vector<Node_*,_std::allocator<Node_*>_> *local_48;
  Parser *local_40;
  vector<Token_*,_std::allocator<Token_*>_> *local_38;
  
  local_48 = default_values;
  local_38 = params_tokens;
  this_00 = (Node *)operator_new(0x30);
  local_40 = this;
  CompilationContext::Poolable::Poolable((Poolable *)this_00,this->ctx);
  this_00->tok = t;
  (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00->nodeType = PNT_FUNCTION_PARAMETERS_LIST;
  if ((params->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (params->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    local_50 = (vector<Node*,std::allocator<Node*>> *)&this_00->children;
    lVar6 = 0;
    uVar7 = 0;
    do {
      pNVar5 = (Node *)operator_new(0x30);
      pTVar2 = (local_38->super__Vector_base<Token_*,_std::allocator<Token_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar7];
      CompilationContext::Poolable::Poolable((Poolable *)pNVar5,local_40->ctx);
      pNVar5->tok = pTVar2;
      (pNVar5->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pNVar5->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pNVar5->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pNVar5->nodeType = PNT_UNKNOWN;
      pNVar5->nodeType = PNT_FUNCTION_PARAMETER;
      __args = (Node **)((long)(params->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl
                               .super__Vector_impl_data._M_start + lVar6);
      iVar3._M_current =
           (pNVar5->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_58 = pNVar5;
      if (iVar3._M_current ==
          (pNVar5->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                  ((vector<Node*,std::allocator<Node*>> *)&pNVar5->children,iVar3,__args);
      }
      else {
        *iVar3._M_current = *__args;
        pppNVar1 = &(pNVar5->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppNVar1 = *pppNVar1 + 1;
      }
      ppNVar4 = (local_48->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pNVar5 = *(Node **)((long)ppNVar4 + lVar6);
      if (pNVar5 != (Node *)0x0) {
        iVar3._M_current =
             (local_58->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (local_58->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                    ((vector<Node*,std::allocator<Node*>> *)&local_58->children,iVar3,
                     (Node **)((long)ppNVar4 + lVar6));
        }
        else {
          *iVar3._M_current = pNVar5;
          pppNVar1 = &(local_58->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppNVar1 = *pppNVar1 + 1;
        }
      }
      iVar3._M_current =
           (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                  (local_50,iVar3,&local_58);
      }
      else {
        *iVar3._M_current = local_58;
        pppNVar1 = &(this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppNVar1 = *pppNVar1 + 1;
      }
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 8;
    } while (uVar7 < (ulong)((long)(params->super__Vector_base<Node_*,_std::allocator<Node_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(params->super__Vector_base<Node_*,_std::allocator<Node_*>_>).
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return this_00;
}

Assistant:

Node * createFunctionParametersListNode(Token & t, vector<Token *> & params_tokens,
    vector<Node *> & params, vector<Node *> & default_values)
  {
    Node * n = new Node(ctx, t);
    n->nodeType = PNT_FUNCTION_PARAMETERS_LIST;

    for (size_t i = 0; i < params.size(); i++)
    {
      Node * param = new Node(ctx, *params_tokens[i]);
      param->nodeType = PNT_FUNCTION_PARAMETER;
      param->children.push_back(params[i]);
      if (default_values[i])
        param->children.push_back(default_values[i]);
      n->children.push_back(param);
    }

    return n;
  }